

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.h
# Opt level: O3

int LocaleIndependentAtoi<int>(string_view str)

{
  int iVar1;
  void *pvVar2;
  size_type sVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  __integer_from_chars_result_type<int> _Var7;
  int result;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  long local_28;
  
  pcVar6 = str._M_str;
  uVar5 = str._M_len;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_len = uVar5;
  local_38._M_str = pcVar6;
  if (uVar5 != 0) {
    uVar4 = 0;
    do {
      pvVar2 = memchr(" \f\n\r\t\v",(int)pcVar6[uVar4],6);
      if (pvVar2 == (void *)0x0) {
        if (uVar4 != 0xffffffffffffffff) {
          sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                            (&local_38," \f\n\r\t\v",0xffffffffffffffff,6);
          if (local_38._M_len < uVar4) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
              std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > __size (which is %zu)",
                         "basic_string_view::substr",uVar4);
            }
            goto LAB_00146a81;
          }
          uVar5 = (sVar3 - uVar4) + 1;
          if (local_38._M_len - uVar4 < uVar5) {
            uVar5 = local_38._M_len - uVar4;
          }
          pcVar6 = local_38._M_str + uVar4;
          if (uVar5 == 0) {
            uVar5 = 0;
            goto LAB_001469fd;
          }
          if (*pcVar6 != '+') goto LAB_001469fd;
          if ((uVar5 != 1) && (local_38._M_str[uVar4 + 1] == '-')) goto LAB_00146a31;
          uVar5 = uVar5 - 1;
          pcVar6 = local_38._M_str + uVar4 + 1;
          goto LAB_001469fd;
        }
        break;
      }
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  uVar5 = 0;
  pcVar6 = (char *)0x0;
LAB_001469fd:
  _Var7 = std::from_chars<int>(pcVar6,pcVar6 + uVar5,(int *)&local_38,10);
  if (_Var7.ec == 0) {
    iVar1 = (int)local_38._M_len;
  }
  else if (_Var7.ec == result_out_of_range) {
    if ((uVar5 == 0) || (iVar1 = -0x80000000, *pcVar6 != '-')) {
      iVar1 = 0x7fffffff;
    }
  }
  else {
LAB_00146a31:
    iVar1 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar1;
  }
LAB_00146a81:
  __stack_chk_fail();
}

Assistant:

T LocaleIndependentAtoi(std::string_view str)
{
    static_assert(std::is_integral<T>::value);
    T result;
    // Emulate atoi(...) handling of white space and leading +/-.
    std::string_view s = util::TrimStringView(str);
    if (!s.empty() && s[0] == '+') {
        if (s.length() >= 2 && s[1] == '-') {
            return 0;
        }
        s = s.substr(1);
    }
    auto [_, error_condition] = std::from_chars(s.data(), s.data() + s.size(), result);
    if (error_condition == std::errc::result_out_of_range) {
        if (s.length() >= 1 && s[0] == '-') {
            // Saturate underflow, per strtoll's behavior.
            return std::numeric_limits<T>::min();
        } else {
            // Saturate overflow, per strtoll's behavior.
            return std::numeric_limits<T>::max();
        }
    } else if (error_condition != std::errc{}) {
        return 0;
    }
    return result;
}